

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O2

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,FieldInvocation *ptr)

{
  Address *pAVar1;
  int iVar2;
  mapped_type *pmVar3;
  ExpressionWrapper *this_00;
  undefined4 extraout_var;
  _Elt_pointer ppAVar4;
  
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->addresses,ptr->name);
  ppAVar4 = (pmVar3->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar4 ==
      (pmVar3->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar4 = (pmVar3->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pAVar1 = ppAVar4[-1];
  this_00 = (ExpressionWrapper *)operator_new(0x10);
  iVar2 = (*pAVar1->_vptr_Address[2])(pAVar1);
  IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)CONCAT44(extraout_var,iVar2));
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(FieldInvocation* ptr) {
    //name

    auto address = addresses[*ptr->name].top();
    curr_wrapper = new IRT::ExpressionWrapper(address->ToExpression());
}